

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  byte *pbVar6;
  uint32_t uVar7;
  int iVar8;
  size_t sVar9;
  HuffmanCode *pHVar10;
  HuffmanCode *pHVar11;
  ulong uVar12;
  uint32_t uVar13;
  uint8_t *puVar14;
  uint32_t *puVar15;
  uint64_t uVar16;
  uint uVar17;
  BrotliBitReader *br;
  bool bVar18;
  uint32_t block_type;
  uint32_t index;
  uint local_50;
  uint local_4c;
  size_t local_48;
  uint8_t *local_40;
  uint64_t local_38;
  
  uVar3 = s->num_block_types[0];
  if (uVar3 < 2) {
    return 0;
  }
  br = &s->br;
  local_38 = (s->br).val_;
  uVar4 = (s->br).bit_pos_;
  local_40 = (s->br).next_in;
  local_48 = (s->br).avail_in;
  bVar18 = uVar4 - 0x32 < 0xf;
  uVar13 = uVar4;
  if (bVar18) {
    sVar9 = (s->br).avail_in;
    puVar14 = local_40;
    if (sVar9 != 0) {
      uVar16 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      uVar7 = uVar4;
      do {
        uVar13 = uVar7 - 8;
        sVar9 = sVar9 - 1;
        puVar14 = (uint8_t *)(uVar16 >> 8);
        (s->br).val_ = (uint64_t)puVar14;
        uVar16 = (ulong)*pbVar6 << 0x38 | uVar16 >> 8;
        (s->br).val_ = uVar16;
        (s->br).bit_pos_ = uVar13;
        (s->br).avail_in = sVar9;
        (s->br).next_in = pbVar6 + 1;
        bVar18 = uVar7 - 0x3a < 0xf;
        if (!bVar18) goto LAB_00142e3d;
        pbVar6 = pbVar6 + 1;
        uVar7 = uVar13;
      } while (sVar9 != 0);
    }
  }
  else {
LAB_00142e3d:
    puVar14 = (uint8_t *)(ulong)((uint)(br->val_ >> ((byte)uVar13 & 0x3f)) & 0x7fff);
  }
  puVar15 = (uint32_t *)s->block_type_trees;
  pHVar11 = s->block_len_trees;
  if (bVar18) {
    iVar8 = SafeDecodeSymbol((HuffmanCode *)puVar15,br,&local_50);
    if (iVar8 == 0) {
      return 0;
    }
  }
  else {
    pHVar10 = (HuffmanCode *)puVar15 + ((ulong)puVar14 & 0xff);
    bVar2 = pHVar10->bits;
    if (8 < bVar2) {
      puVar15 = &(s->br).bit_pos_;
      *puVar15 = *puVar15 + 8;
      puVar15 = kBitMask;
      pHVar10 = pHVar10 + (((uint)((ulong)puVar14 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                          (uint)pHVar10->value);
    }
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 + (uint)pHVar10->bits;
    local_50 = (uint)pHVar10->value;
  }
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar13 = (s->br).bit_pos_;
    bVar18 = uVar13 - 0x32 < 0xf;
    if (bVar18) {
      sVar9 = (s->br).avail_in;
      if (sVar9 != 0) {
        uVar16 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        uVar7 = uVar13;
        do {
          uVar13 = uVar7 - 8;
          sVar9 = sVar9 - 1;
          puVar15 = (uint32_t *)(uVar16 >> 8);
          (s->br).val_ = (uint64_t)puVar15;
          uVar16 = (ulong)*pbVar6 << 0x38 | uVar16 >> 8;
          (s->br).val_ = uVar16;
          (s->br).bit_pos_ = uVar13;
          (s->br).avail_in = sVar9;
          (s->br).next_in = pbVar6 + 1;
          bVar18 = uVar7 - 0x3a < 0xf;
          if (!bVar18) goto LAB_00142f1e;
          pbVar6 = pbVar6 + 1;
          uVar7 = uVar13;
        } while (sVar9 != 0);
      }
    }
    else {
LAB_00142f1e:
      puVar15 = (uint32_t *)(ulong)((uint)(br->val_ >> ((byte)uVar13 & 0x3f)) & 0x7fff);
    }
    if (bVar18) {
      iVar8 = SafeDecodeSymbol(pHVar11,br,&local_4c);
      if (iVar8 == 0) goto LAB_00143042;
    }
    else {
      pHVar11 = pHVar11 + ((ulong)puVar15 & 0xff);
      bVar2 = pHVar11->bits;
      if (8 < bVar2) {
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 + 8;
        pHVar11 = pHVar11 + (((uint)((ulong)puVar15 >> 8) & 0xffffff & kBitMask[bVar2 - 8]) +
                            (uint)pHVar11->value);
      }
      puVar15 = &(s->br).bit_pos_;
      *puVar15 = *puVar15 + (uint)pHVar11->bits;
      local_4c = (uint)pHVar11->value;
    }
  }
  else {
    local_4c = s->block_length_index;
  }
  bVar2 = kBlockLengthPrefixCode[local_4c].nbits;
  uVar13 = (s->br).bit_pos_;
  bVar18 = 0x40 - uVar13 < (uint)bVar2;
  if (bVar18) {
    sVar9 = (s->br).avail_in;
    if (sVar9 != 0) {
      uVar16 = (s->br).val_;
      uVar17 = 0x48 - uVar13;
      pbVar6 = (s->br).next_in;
      do {
        uVar13 = uVar13 - 8;
        sVar9 = sVar9 - 1;
        (s->br).val_ = uVar16 >> 8;
        uVar16 = (ulong)*pbVar6 << 0x38 | uVar16 >> 8;
        (s->br).val_ = uVar16;
        (s->br).bit_pos_ = uVar13;
        (s->br).avail_in = sVar9;
        (s->br).next_in = pbVar6 + 1;
        bVar18 = uVar17 < bVar2;
        if (!bVar18) goto LAB_00142ff9;
        uVar17 = uVar17 + 8;
        pbVar6 = pbVar6 + 1;
      } while (sVar9 != 0);
    }
  }
  else {
LAB_00142ff9:
    br = (BrotliBitReader *)
         (ulong)((uint)((s->br).val_ >> ((byte)uVar13 & 0x3f)) & kBitMask[(uint)bVar2]);
    (s->br).bit_pos_ = uVar13 + bVar2;
  }
  if (!bVar18) {
    s->block_length[0] = (int)br + (uint)kBlockLengthPrefixCode[local_4c].offset;
  }
  else {
    s->block_length_index = local_4c;
  }
  s->substate_read_block_length = (uint)bVar18;
  if (!bVar18) {
    if (local_50 == 0) {
      local_50 = s->block_type_rb[0];
    }
    else if (local_50 == 1) {
      local_50 = s->block_type_rb[1] + 1;
    }
    else {
      local_50 = local_50 - 2;
    }
    if (uVar3 <= local_50) {
      local_50 = local_50 - uVar3;
    }
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_50;
    if ((s->field_0x338 & 0x40) != 0) {
      if (s->saved_position_literals_begin != 0) {
        sVar9 = (s->literals_block_splits).num_blocks;
        (s->literals_block_splits).positions_end[sVar9] = position;
        (s->literals_block_splits).num_blocks = sVar9 + 1;
      }
      sVar9 = (s->literals_block_splits).num_blocks;
      (s->literals_block_splits).positions_begin[sVar9] = position;
      (s->literals_block_splits).types[sVar9] =
           (char)(int)(s->literals_block_splits).num_types_prev_metablocks +
           (char)s->block_type_rb[1];
      uVar5 = (s->literals_block_splits).num_types;
      uVar12 = (ulong)(s->literals_block_splits).types[(s->literals_block_splits).num_blocks] + 1;
      if (uVar12 < uVar5) {
        uVar12 = uVar5;
      }
      (s->literals_block_splits).num_types = uVar12;
    }
    uVar3 = s->block_type_rb[1];
    s->context_map_slice = s->context_map + (uVar3 << 6);
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
    s->literal_htree = (s->literal_hgroup).htrees[s->context_map[uVar3 << 6]];
    s->context_lookup = "" + ((s->context_modes[uVar3] & 3) << 9);
    return 1;
  }
LAB_00143042:
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  (s->br).val_ = local_38;
  (s->br).bit_pos_ = uVar4;
  (s->br).next_in = local_40;
  (s->br).avail_in = local_48;
  return 0;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}